

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tanh_sinh_detail.hpp
# Opt level: O3

void __thiscall
boost::math::quadrature::detail::
tanh_sinh_detail<double,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
::extend_refinements
          (tanh_sinh_detail<double,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
           *this)

{
  uint uVar1;
  iterator iVar2;
  bool bVar3;
  long lVar4;
  int iVar5;
  undefined8 uVar6;
  unsigned_long uVar7;
  pthread_mutex_t *__mutex;
  ulong uVar8;
  vector<double,_std::allocator<double>_> *pvVar9;
  size_type __n;
  double __x;
  double dVar10;
  double __x_00;
  double u2;
  double local_70;
  double local_68;
  double local_60;
  pthread_mutex_t *local_58;
  double local_50;
  long local_48;
  ulong local_40;
  double local_38;
  
  __mutex = (pthread_mutex_t *)&this->m_mutex;
  iVar5 = pthread_mutex_lock(__mutex);
  if (iVar5 != 0) {
    uVar6 = std::__throw_system_error(iVar5);
    pthread_mutex_unlock(local_58);
    _Unwind_Resume(uVar6);
  }
  if (this->m_max_refinements <=
      (ulong)(this->m_committed_refinements).super___atomic_base<unsigned_int>._M_i)
  goto LAB_0011393c;
  LOCK();
  (this->m_committed_refinements).super___atomic_base<unsigned_int>._M_i =
       (this->m_committed_refinements).super___atomic_base<unsigned_int>._M_i + 1;
  UNLOCK();
  uVar1 = (this->m_committed_refinements).super___atomic_base<unsigned_int>._M_i;
  uVar8 = (ulong)uVar1;
  __x = ldexp(1.0,-uVar1);
  local_50 = __x + __x;
  dVar10 = ceil((this->m_t_max - __x) / local_50);
  local_58 = __mutex;
  if ((ulong)ABS(dVar10) < 0x7ff0000000000000) {
    if ((dVar10 <= 2147483647.0) && (-2147483648.0 <= dVar10)) goto LAB_0011373d;
    local_70 = dVar10;
    policies::detail::raise_error<boost::math::rounding_error,double>
              ("boost::math::itrunc<%1%>(%1%)",
               "Value %1% can not be represented in the target integer type.",&local_70);
    __n = 0;
  }
  else {
    local_70 = dVar10;
    policies::detail::raise_error<boost::math::rounding_error,double>
              ("boost::math::trunc<%1%>(%1%)",
               "Value %1% can not be represented in the target integer type.",&local_70);
    dVar10 = 0.0;
LAB_0011373d:
    __n = (size_type)(int)dVar10;
  }
  std::vector<double,_std::allocator<double>_>::reserve
            ((this->m_abscissas).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + uVar8,__n);
  std::vector<double,_std::allocator<double>_>::reserve
            ((this->m_weights).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + uVar8,__n);
  dVar10 = this->m_t_max;
  uVar7 = 0;
  __x_00 = __x;
  local_48 = uVar8 * 3;
  local_40 = uVar8;
  while (lVar4 = local_48, __mutex = local_58, __x_00 < dVar10) {
    local_60 = this->m_t_crossover;
    bVar3 = __x_00 < local_60;
    pvVar9 = (this->m_abscissas).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + uVar8;
    local_68 = __x_00;
    dVar10 = sinh(__x_00);
    dVar10 = dVar10 * 1.5707963267948966;
    if (local_60 <= local_68) {
      local_38 = dVar10;
      local_60 = exp(dVar10);
      dVar10 = cosh(local_38);
      local_70 = -1.0 / (dVar10 * local_60);
    }
    else {
      local_70 = tanh(dVar10);
    }
    iVar2._M_current =
         (pvVar9->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (pvVar9->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                (pvVar9,iVar2,&local_70);
    }
    else {
      *iVar2._M_current = local_70;
      (pvVar9->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_finish = iVar2._M_current + 1;
    }
    uVar7 = uVar7 + bVar3;
    dVar10 = this->m_t_max;
    __x_00 = local_68 + local_50;
  }
  (this->m_first_complements).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start[local_40] = uVar7;
  if (__x < dVar10) {
    do {
      pvVar9 = (vector<double,_std::allocator<double>_> *)
               ((long)&(((this->m_weights).
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data + lVar4 * 8);
      dVar10 = sinh(__x);
      local_68 = cosh(dVar10 * 1.5707963267948966);
      dVar10 = cosh(__x);
      local_70 = (dVar10 * 1.5707963267948966) / (local_68 * local_68);
      iVar2._M_current =
           (pvVar9->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (pvVar9->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (pvVar9,iVar2,&local_70);
      }
      else {
        *iVar2._M_current = local_70;
        (pvVar9->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_finish = iVar2._M_current + 1;
      }
      __x = __x + local_50;
    } while (__x < this->m_t_max);
  }
LAB_0011393c:
  pthread_mutex_unlock(__mutex);
  return;
}

Assistant:

void extend_refinements()const
   {
#ifndef BOOST_MATH_NO_ATOMIC_INT
      boost::detail::lightweight_mutex::scoped_lock guard(m_mutex);
#endif
      //
      // Check some other thread hasn't got here after we read the atomic variable, but before we got here:
      //
#ifndef BOOST_MATH_NO_ATOMIC_INT
      if (m_committed_refinements.load() >= m_max_refinements)
         return;
#else
      if (m_committed_refinements >= m_max_refinements)
         return;
#endif

      using std::ldexp;
      using std::ceil;
      ++m_committed_refinements;
#ifndef BOOST_MATH_NO_ATOMIC_INT
      std::size_t row = m_committed_refinements.load();
#else
      std::size_t row = m_committed_refinements;
#endif
      Real h = ldexp(Real(1), -static_cast<int>(row));
      std::size_t first_complement = 0;
      std::size_t n = boost::math::itrunc(ceil((m_t_max - h) / (2 * h)));
      m_abscissas[row].reserve(n);
      m_weights[row].reserve(n);
      for (Real pos = h; pos < m_t_max; pos += 2 * h)
      {
         if (pos < m_t_crossover)
            ++first_complement;
         m_abscissas[row].push_back(pos < m_t_crossover ? abscissa_at_t(pos) : -abscissa_complement_at_t(pos));
      }
      m_first_complements[row] = first_complement;
      for (Real pos = h; pos < m_t_max; pos += 2 * h)
         m_weights[row].push_back(weight_at_t(pos));
   }